

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

int IsMultiplexingPossible(Curl_easy *handle,connectdata *conn)

{
  _Bool _Var1;
  int local_1c;
  int avail;
  connectdata *conn_local;
  Curl_easy *handle_local;
  
  local_1c = 0;
  if ((((conn->handler->protocol & 3) != 0) &&
      ((((*(uint *)&(conn->bits).field_0x4 >> 0xc & 1) == 0 ||
        ((*(uint *)&(conn->bits).field_0x4 & 1) == 0)) &&
       (_Var1 = Curl_multiplex_wanted(handle->multi), _Var1)))) && (2 < (handle->set).httpversion))
  {
    local_1c = 2;
  }
  return local_1c;
}

Assistant:

static int IsMultiplexingPossible(const struct Curl_easy *handle,
                                  const struct connectdata *conn)
{
  int avail = 0;

  /* If a HTTP protocol and multiplexing is enabled */
  if((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
     (!conn->bits.protoconnstart || !conn->bits.close)) {

    if(Curl_multiplex_wanted(handle->multi) &&
       (handle->set.httpversion >= CURL_HTTP_VERSION_2))
      /* allows HTTP/2 */
      avail |= CURLPIPE_MULTIPLEX;
  }
  return avail;
}